

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

ssize __thiscall Socket::recvFrom(Socket *this,byte *data,usize maxSize,uint32 *ip,uint16 *port)

{
  uint16_t uVar1;
  uint32_t uVar2;
  ssize_t sVar3;
  int *piVar4;
  ssize r;
  undefined1 local_48 [4];
  socklen_t sinSize;
  sockaddr_in sin;
  uint16 *port_local;
  uint32 *ip_local;
  usize maxSize_local;
  byte *data_local;
  Socket *this_local;
  
  r._4_4_ = 0x10;
  sin.sin_zero = (uchar  [8])port;
  sVar3 = recvfrom(this->s,data,(long)(int)maxSize,0,(sockaddr *)local_48,
                   (socklen_t *)((long)&r + 4));
  if (sVar3 == -1) {
    piVar4 = __errno_location();
    if ((*piVar4 == 0xb) || (piVar4 = __errno_location(), *piVar4 == 0xb)) {
      piVar4 = __errno_location();
      *piVar4 = 0;
    }
    return -1;
  }
  uVar2 = ntohl(sinSize);
  *ip = uVar2;
  uVar1 = ntohs(local_48._2_2_);
  *(uint16_t *)sin.sin_zero = uVar1;
  return sVar3;
}

Assistant:

ssize Socket::recvFrom(byte* data, usize maxSize, uint32& ip, uint16& port)
{
  struct sockaddr_in sin;
  socklen_t sinSize = sizeof(sin);

  ssize r = ::recvfrom(s, (char*)data, (int)maxSize, 0, (sockaddr*)&sin, &sinSize);
  if(r == SOCKET_ERROR)
  {
    if(ERRNO == EWOULDBLOCK 
#ifndef _WIN32
      || ERRNO == EAGAIN
#endif
      )
    {
      SET_ERRNO(0);
    }
    return -1;
  }
  ip = ntohl(sin.sin_addr.s_addr);
  port = ntohs(sin.sin_port);
  return r;
}